

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O1

DdNode * Cudd_bddUnivAbstract(DdManager *manager,DdNode *f,DdNode *cube)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  iVar1 = bddCheckPositiveCube(manager,cube);
  if (iVar1 == 0) {
    fwrite("Error: Can only abstract positive cubes\n",0x28,1,(FILE *)manager->err);
    manager->errorCode = CUDD_INVALID_ARG;
    pDVar3 = (DdNode *)0x0;
  }
  else {
    do {
      manager->reordered = 0;
      pDVar2 = cuddBddExistAbstractRecur(manager,(DdNode *)((ulong)f ^ 1),cube);
    } while (manager->reordered == 1);
    pDVar3 = (DdNode *)((ulong)pDVar2 ^ 1);
    if (pDVar2 == (DdNode *)0x0) {
      pDVar3 = (DdNode *)0x0;
    }
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_bddUnivAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode      *res;

    if (bddCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,
                       "Error: Can only abstract positive cubes\n");
        manager->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddBddExistAbstractRecur(manager, Cudd_Not(f), cube);
    } while (manager->reordered == 1);
    if (res != NULL) res = Cudd_Not(res);

    return(res);

}